

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O0

iterator __thiscall
prevector<28U,_unsigned_char,_unsigned_int,_int>::erase
          (prevector<28U,_unsigned_char,_unsigned_int,_int> *this,iterator first,iterator last)

{
  long lVar1;
  difference_type dVar2;
  uchar *puVar3;
  uchar *__dest;
  uchar *__src;
  uchar *puVar4;
  uchar *in_RSI;
  iterator in_RDI;
  long in_FS_OFFSET;
  char *endp;
  iterator p;
  iterator *in_stack_ffffffffffffff78;
  iterator in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  end((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_RDI.ptr);
  puVar3 = iterator::operator*(in_stack_ffffffffffffff78);
  dVar2 = ::operator-(in_stack_ffffffffffffff88,in_RDI);
  *(int *)(in_RDI.ptr + 0x1c) = *(int *)(in_RDI.ptr + 0x1c) - dVar2;
  __dest = iterator::operator*(in_stack_ffffffffffffff78);
  __src = iterator::operator*(in_stack_ffffffffffffff78);
  puVar4 = iterator::operator*(in_stack_ffffffffffffff78);
  memmove(__dest,__src,(long)puVar3 - (long)puVar4);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)in_RSI;
  }
  __stack_chk_fail();
}

Assistant:

iterator erase(iterator first, iterator last) {
        // Erase is not allowed to the change the object's capacity. That means
        // that when starting with an indirectly allocated prevector with
        // size and capacity > N, the result may be a still indirectly allocated
        // prevector with size <= N and capacity > N. A shrink_to_fit() call is
        // necessary to switch to the (more efficient) directly allocated
        // representation (with capacity N and size <= N).
        iterator p = first;
        char* endp = (char*)&(*end());
        _size -= last - p;
        memmove(&(*first), &(*last), endp - ((char*)(&(*last))));
        return first;
    }